

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void NeedsFilter_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh,__m128i *mask)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 uVar19;
  byte bVar20;
  undefined1 uVar21;
  byte bVar22;
  undefined1 uVar23;
  byte bVar24;
  undefined1 auVar18 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar23 = (undefined1)((uint)thresh >> 0x18);
  uVar21 = (undefined1)((uint)thresh >> 0x10);
  uVar19 = (undefined1)((uint)thresh >> 8);
  auVar18._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar23,uVar23),uVar21),CONCAT14(uVar21,thresh)) >> 0x20);
  auVar18[3] = uVar19;
  auVar18[2] = uVar19;
  auVar18[0] = (undefined1)thresh;
  auVar18[1] = auVar18[0];
  auVar18._8_8_ = 0;
  auVar18 = pshuflw(auVar18,auVar18,0);
  auVar26 = psubusb((undefined1  [16])*q1,(undefined1  [16])*p1);
  auVar25 = psubusb((undefined1  [16])*p1,(undefined1  [16])*q1);
  auVar25 = auVar25 | auVar26;
  auVar26._0_2_ = auVar25._0_2_ >> 1;
  auVar26._2_2_ = auVar25._2_2_ >> 1;
  auVar26._4_2_ = auVar25._4_2_ >> 1;
  auVar26._6_2_ = auVar25._6_2_ >> 1;
  auVar26._8_2_ = auVar25._8_2_ >> 1;
  auVar26._10_2_ = auVar25._10_2_ >> 1;
  auVar26._12_2_ = auVar25._12_2_ >> 1;
  auVar26._14_2_ = auVar25._14_2_ >> 1;
  auVar27 = psubusb((undefined1  [16])*q0,(undefined1  [16])*p0);
  auVar25 = psubusb((undefined1  [16])*p0,(undefined1  [16])*q0);
  auVar25 = paddusb(auVar25 | auVar27,auVar25 | auVar27);
  auVar25 = paddusb(auVar26 & _DAT_001a9060,auVar25);
  bVar1 = auVar25[0];
  bVar17 = auVar18[0];
  bVar2 = auVar25[1];
  bVar20 = auVar18[1];
  bVar3 = auVar25[2];
  bVar22 = auVar18[2];
  bVar4 = auVar25[3];
  bVar24 = auVar18[3];
  bVar5 = auVar25[4];
  bVar6 = auVar25[5];
  bVar7 = auVar25[6];
  bVar8 = auVar25[7];
  bVar9 = auVar25[8];
  bVar10 = auVar25[9];
  bVar11 = auVar25[10];
  bVar12 = auVar25[0xb];
  bVar13 = auVar25[0xc];
  bVar14 = auVar25[0xd];
  bVar15 = auVar25[0xe];
  bVar16 = auVar25[0xf];
  *(char *)*mask = -((byte)((bVar1 < bVar17) * bVar1 | (bVar1 >= bVar17) * bVar17) == bVar1);
  *(char *)((long)*mask + 1) =
       -((byte)((bVar2 < bVar20) * bVar2 | (bVar2 >= bVar20) * bVar20) == bVar2);
  *(char *)((long)*mask + 2) =
       -((byte)((bVar3 < bVar22) * bVar3 | (bVar3 >= bVar22) * bVar22) == bVar3);
  *(char *)((long)*mask + 3) =
       -((byte)((bVar4 < bVar24) * bVar4 | (bVar4 >= bVar24) * bVar24) == bVar4);
  *(char *)((long)*mask + 4) =
       -((byte)((bVar5 < bVar17) * bVar5 | (bVar5 >= bVar17) * bVar17) == bVar5);
  *(char *)((long)*mask + 5) =
       -((byte)((bVar6 < bVar20) * bVar6 | (bVar6 >= bVar20) * bVar20) == bVar6);
  *(char *)((long)*mask + 6) =
       -((byte)((bVar7 < bVar22) * bVar7 | (bVar7 >= bVar22) * bVar22) == bVar7);
  *(char *)((long)*mask + 7) =
       -((byte)((bVar8 < bVar24) * bVar8 | (bVar8 >= bVar24) * bVar24) == bVar8);
  *(char *)(*mask + 1) = -((byte)((bVar9 < bVar17) * bVar9 | (bVar9 >= bVar17) * bVar17) == bVar9);
  *(char *)((long)*mask + 9) =
       -((byte)((bVar10 < bVar20) * bVar10 | (bVar10 >= bVar20) * bVar20) == bVar10);
  *(char *)((long)*mask + 10) =
       -((byte)((bVar11 < bVar22) * bVar11 | (bVar11 >= bVar22) * bVar22) == bVar11);
  *(char *)((long)*mask + 0xb) =
       -((byte)((bVar12 < bVar24) * bVar12 | (bVar12 >= bVar24) * bVar24) == bVar12);
  *(char *)((long)*mask + 0xc) =
       -((byte)((bVar13 < bVar17) * bVar13 | (bVar13 >= bVar17) * bVar17) == bVar13);
  *(char *)((long)*mask + 0xd) =
       -((byte)((bVar14 < bVar20) * bVar14 | (bVar14 >= bVar20) * bVar20) == bVar14);
  *(char *)((long)*mask + 0xe) =
       -((byte)((bVar15 < bVar22) * bVar15 | (bVar15 >= bVar22) * bVar22) == bVar15);
  *(char *)((long)*mask + 0xf) =
       -((byte)((bVar16 < bVar24) * bVar16 | (bVar16 >= bVar24) * bVar24) == bVar16);
  return;
}

Assistant:

static WEBP_INLINE void NeedsFilter_SSE2(const __m128i* const p1,
                                         const __m128i* const p0,
                                         const __m128i* const q0,
                                         const __m128i* const q1,
                                         int thresh, __m128i* const mask) {
  const __m128i m_thresh = _mm_set1_epi8((char)thresh);
  const __m128i t1 = MM_ABS(*p1, *q1);        // abs(p1 - q1)
  const __m128i kFE = _mm_set1_epi8((char)0xFE);
  const __m128i t2 = _mm_and_si128(t1, kFE);  // set lsb of each byte to zero
  const __m128i t3 = _mm_srli_epi16(t2, 1);   // abs(p1 - q1) / 2

  const __m128i t4 = MM_ABS(*p0, *q0);        // abs(p0 - q0)
  const __m128i t5 = _mm_adds_epu8(t4, t4);   // abs(p0 - q0) * 2
  const __m128i t6 = _mm_adds_epu8(t5, t3);   // abs(p0-q0)*2 + abs(p1-q1)/2

  const __m128i t7 = _mm_subs_epu8(t6, m_thresh);  // mask <= m_thresh
  *mask = _mm_cmpeq_epi8(t7, _mm_setzero_si128());
}